

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall wasm::Literal::floorF64x2(Literal *__return_storage_ptr__,Literal *this)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  Literal *this_00;
  double extraout_XMM0_Qa;
  double __x;
  double extraout_XMM0_Qa_00;
  Literal local_78;
  undefined1 local_60 [8];
  LaneArray<2> lanes;
  
  getLanesF64x2((LaneArray<2> *)local_60,this);
  this_00 = (Literal *)local_60;
  __x = extraout_XMM0_Qa;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    floor(&local_78,__x);
    ~Literal(this_00);
    Literal(this_00,&local_78);
    ~Literal(&local_78);
    this_00 = (Literal *)&lanes._M_elems[0].type;
    __x = extraout_XMM0_Qa_00;
    bVar1 = false;
  } while (bVar2);
  Literal(__return_storage_ptr__,(LaneArray<2> *)local_60);
  lVar3 = 0x18;
  do {
    ~Literal((Literal *)(local_60 + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::floorF64x2() const {
  return unary<2, &Literal::getLanesF64x2, &Literal::floor>(*this);
}